

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

shared_ptr<notch::core::FullyConnectedLayer> __thiscall notch::core::MakeLayer::FC(MakeLayer *this)

{
  valarray<float> *__args;
  valarray<float> *__args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  MakeLayer *in_RSI;
  undefined1 *__args_2;
  shared_ptr<notch::core::FullyConnectedLayer> sVar2;
  undefined1 local_41;
  string local_40;
  
  __args_2 = (undefined1 *)in_RSI->maybeActivation;
  if ((Activation *)__args_2 == (Activation *)0x0) {
    __args_2 = linearActivation;
    in_RSI->maybeActivation = (Activation *)linearActivation;
  }
  __args = (in_RSI->maybeWeights).
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((__args == (valarray<float> *)0x0) ||
     (__args_1 = (in_RSI->maybeBias).
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     __args_1 == (valarray<float> *)0x0)) {
    if ((in_RSI->nInputs == 0) || (in_RSI->nOutputs == 0)) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"a FullyConnectedLayer","");
      logic_error(in_RSI,&local_40);
      _Var1._M_pi = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
        _Var1._M_pi = extraout_RDX_02;
      }
      this->nInputs = 0;
      this->nOutputs = 0;
    }
    else {
      this->nInputs = 0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<notch::core::FullyConnectedLayer,std::allocator<notch::core::FullyConnectedLayer>,unsigned_long&,unsigned_long&,notch::core::Activation_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->nOutputs,
                 (FullyConnectedLayer **)this,
                 (allocator<notch::core::FullyConnectedLayer> *)&local_41,&in_RSI->nInputs,
                 &in_RSI->nOutputs,(Activation *)__args_2);
      _Var1._M_pi = extraout_RDX_00;
    }
  }
  else {
    this->nInputs = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<notch::core::FullyConnectedLayer,std::allocator<notch::core::FullyConnectedLayer>,std::valarray<float>&,std::valarray<float>&,notch::core::Activation_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->nOutputs,
               (FullyConnectedLayer **)this,(allocator<notch::core::FullyConnectedLayer> *)&local_41
               ,__args,__args_1,(Activation *)__args_2);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::FullyConnectedLayer>)
         sVar2.super___shared_ptr<notch::core::FullyConnectedLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FullyConnectedLayer> FC() {
        if (!maybeActivation) {
            maybeActivation = &linearActivation;
        }
        if (maybeWeights && maybeBias) {
            return std::make_shared<FullyConnectedLayer>
                (*maybeWeights, *maybeBias, *maybeActivation);
        } else if (nInputs && nOutputs) {
            return std::make_shared<FullyConnectedLayer>
                (nInputs, nOutputs, *maybeActivation);
        } else {
            logic_error("a FullyConnectedLayer");
            return nullptr; // unreachable
        }
    }